

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O2

void __thiscall miniros::IntraProcessSubscriberLink::drop(IntraProcessSubscriberLink *this)

{
  recursive_mutex *__mutex;
  element_type *peVar1;
  allocator<char> local_41;
  string local_40;
  PublicationPtr parent;
  
  __mutex = &this->drop_mutex_;
  std::recursive_mutex::lock(__mutex);
  if (this->dropped_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this->dropped_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  peVar1 = (this->subscriber_).
           super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_PublisherLink)._vptr_PublisherLink[5])();
    std::__shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->subscriber_).
                super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr();
  if (parent.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (drop::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"miniros.intraprocess_subscriber_link",&local_41);
      console::initializeLogLocation(&drop::loc,&local_40,Debug);
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (drop::loc.level_ != Debug) {
      console::setLogLocationLevel(&drop::loc,Debug);
      console::checkLogLocationEnabled(&drop::loc);
    }
    if (drop::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,drop::loc.logger_,drop::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/intraprocess_subscriber_link.cpp"
                     ,0x73,"virtual void miniros::IntraProcessSubscriberLink::drop()",
                     "Connection to local subscriber on topic [%s] dropped",
                     (this->super_SubscriberLink).topic_._M_dataplus._M_p);
    }
    std::__shared_ptr<miniros::SubscriberLink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::SubscriberLink,void>
              ((__shared_ptr<miniros::SubscriberLink,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__weak_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_SubscriberLink).super_enable_shared_from_this<miniros::SubscriberLink>)
    ;
    Publication::removeSubscriberLink
              (parent.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (SubscriberLinkPtr *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void IntraProcessSubscriberLink::drop()
{
  {
    std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  if (subscriber_)
  {
    subscriber_->drop();
    subscriber_.reset();
  }

  if (PublicationPtr parent = parent_.lock())
  {
    MINIROS_DEBUG("Connection to local subscriber on topic [%s] dropped", topic_.c_str());

    parent->removeSubscriberLink(shared_from_this());
  }
}